

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rabinkarphash.h
# Opt level: O2

void __thiscall
KarpRabinHash<unsigned_int,_unsigned_char>::KarpRabinHash
          (KarpRabinHash<unsigned_int,_unsigned_char> *this,int myn,int mywordsize)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  
  this->hashvalue = 0;
  this->n = myn;
  this->wordsize = mywordsize;
  uVar1 = maskfnc<unsigned_int>(mywordsize);
  CharacterHash<unsigned_int,_unsigned_char>::CharacterHash(&this->hasher,uVar1);
  uVar1 = maskfnc<unsigned_int>(this->wordsize);
  this->HASHMASK = uVar1;
  this->BtoN = 1;
  iVar2 = 0;
  if (0 < this->n) {
    iVar2 = this->n;
  }
  uVar3 = 1;
  while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
    uVar3 = uVar3 * 0x25 & uVar1;
    this->BtoN = uVar3;
  }
  return;
}

Assistant:

KarpRabinHash(int myn, int mywordsize = 19)
      : hashvalue(0), n(myn), wordsize(mywordsize),
        hasher(maskfnc<hashvaluetype>(wordsize)),
        HASHMASK(maskfnc<hashvaluetype>(wordsize)), BtoN(1) {
    for (int i = 0; i < n; ++i) {
      BtoN *= B;
      BtoN &= HASHMASK;
    }
  }